

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O1

void __thiscall GMESong::~GMESong(GMESong *this)

{
  SoundStream *pSVar1;
  
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__GMESong_006f4318;
  StreamSong::Stop(&this->super_StreamSong);
  pSVar1 = (this->super_StreamSong).m_Stream;
  if (pSVar1 != (SoundStream *)0x0) {
    (*pSVar1->_vptr_SoundStream[1])();
    (this->super_StreamSong).m_Stream = (SoundStream *)0x0;
  }
  if (this->TrackInfo != (gme_info_t *)0x0) {
    gme_free_info(this->TrackInfo);
  }
  if (this->Emu != (Music_Emu *)0x0) {
    gme_delete(this->Emu);
  }
  FCriticalSection::~FCriticalSection(&this->CritSec);
  StreamSong::~StreamSong(&this->super_StreamSong);
  return;
}

Assistant:

GMESong::~GMESong()
{
	Stop();
	if (m_Stream != NULL)
	{
		delete m_Stream;
		m_Stream = NULL;
	}
	if (TrackInfo != NULL)
	{
		gme_free_info(TrackInfo);
	}
	if (Emu != NULL)
	{
		gme_delete(Emu);
	}
}